

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

void __thiscall
kratos::FSM::FSM(FSM *this,string *name,Generator *generator,shared_ptr<kratos::Var> *clk,
                shared_ptr<kratos::Var> *reset)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 uVar6;
  
  paVar1 = &(this->fsm_name_).field_2;
  (this->fsm_name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar6 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->fsm_name_).field_2 + 8) = uVar6;
  }
  else {
    (this->fsm_name_)._M_dataplus._M_p = pcVar4;
    (this->fsm_name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->fsm_name_)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  this->generator_ = generator;
  (this->outputs_)._M_h._M_buckets = &(this->outputs_)._M_h._M_single_bucket;
  (this->outputs_)._M_h._M_bucket_count = 1;
  (this->outputs_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->outputs_)._M_h._M_element_count = 0;
  (this->outputs_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->outputs_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->outputs_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->clk_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (clk->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->clk_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var5 = (clk->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (clk->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->clk_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var5;
  (clk->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (reset->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var5 = (reset->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (reset->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var5;
  (reset->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  p_Var3 = &(this->states_)._M_t._M_impl.super__Rb_tree_header;
  (this->states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->states_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->state_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->state_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->start_state_debug_).first._M_dataplus._M_p =
       (pointer)&(this->start_state_debug_).first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->start_state_debug_,"");
  (this->start_state_debug_).second = 0;
  this->current_state_ = (EnumVar *)0x0;
  (this->fn_name_ln_)._M_h._M_buckets = &(this->fn_name_ln_)._M_h._M_single_bucket;
  (this->fn_name_ln_)._M_h._M_bucket_count = 1;
  (this->fn_name_ln_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fn_name_ln_)._M_h._M_element_count = 0;
  (this->fn_name_ln_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fn_name_ln_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fn_name_ln_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->realized_ = false;
  this->moore_ = true;
  this->reset_high_ = true;
  this->parent_fsm_ = (FSM *)0x0;
  p_Var3 = &(this->child_fsms_)._M_t._M_impl.super__Rb_tree_header;
  (this->child_fsms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->child_fsms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->child_fsms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->child_fsms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->child_fsms_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

FSM::FSM(std::string name, kratos::Generator* generator, std::shared_ptr<Var> clk,
         std::shared_ptr<Var> reset)
    : fsm_name_(std::move(name)),
      generator_(generator),
      clk_(std::move(clk)),
      reset_(std::move(reset)) {}